

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_relative_location_path
                 (lyxp_expr *exp,uint32_t *tok_idx,ly_bool all_desc,lyxp_set *set,uint32_t options)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  lyxp_axis local_34;
  int scnode_skip_path;
  lyxp_axis axis;
  LY_ERR rc;
  uint32_t options_local;
  lyxp_set *set_local;
  ly_bool all_desc_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  
  scnode_skip_path = 0;
  axis = options;
  set_local._7_1_ = all_desc;
  do {
    if (exp->tokens[*tok_idx] == LYXP_TOKEN_AXISNAME) {
      local_34 = str2axis(exp->expr + exp->tok_pos[*tok_idx],exp->tok_len[*tok_idx]);
      pcVar3 = "parsed";
      if ((axis & 0x20) != LYXP_AXIS_ANCESTOR) {
        pcVar3 = "skipped";
      }
      pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar3,pcVar4,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
      if (exp->tokens[*tok_idx] != LYXP_TOKEN_DCOLON) {
        __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x20d4,
                      "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      pcVar3 = "parsed";
      if ((axis & 0x20) != LYXP_AXIS_ANCESTOR) {
        pcVar3 = "skipped";
      }
      pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar3,pcVar4,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
    }
    else if (exp->tokens[*tok_idx] == LYXP_TOKEN_AT) {
      local_34 = LYXP_AXIS_ATTRIBUTE;
      pcVar3 = "parsed";
      if ((axis & 0x20) != LYXP_AXIS_ANCESTOR) {
        pcVar3 = "skipped";
      }
      pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar3,pcVar4,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
    }
    else {
      local_34 = LYXP_AXIS_CHILD;
    }
    switch(exp->tokens[*tok_idx]) {
    case LYXP_TOKEN_DOT:
      if ((axis & 0x20) == LYXP_AXIS_ANCESTOR) {
        if ((((axis & 0x1c) != LYXP_AXIS_ANCESTOR) && (set->type != LYXP_SET_SCNODE_SET)) ||
           (((axis & 0x1c) == LYXP_AXIS_ANCESTOR && (set->type != LYXP_SET_NODE_SET)))) {
          plVar1 = set->ctx;
          pcVar3 = print_set_type(set);
          ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                  "path operator",pcVar3);
          return LY_EVALID;
        }
        if ((set_local._7_1_ != '\0') &&
           (LVar2 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,axis), LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
        scnode_skip_path = xpath_pi_node(set,LYXP_AXIS_SELF,axis);
        if (scnode_skip_path != LY_SUCCESS) {
          return scnode_skip_path;
        }
      }
      pcVar3 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar3 = "parsed";
      }
      pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar3,pcVar4,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
      break;
    case LYXP_TOKEN_DDOT:
      if ((axis & 0x20) == LYXP_AXIS_ANCESTOR) {
        if ((((axis & 0x1c) != LYXP_AXIS_ANCESTOR) && (set->type != LYXP_SET_SCNODE_SET)) ||
           (((axis & 0x1c) == LYXP_AXIS_ANCESTOR && (set->type != LYXP_SET_NODE_SET)))) {
          plVar1 = set->ctx;
          pcVar3 = print_set_type(set);
          ly_vlog(plVar1,(char *)0x0,LYVE_XPATH,"Cannot apply XPath operation %s on %s.",
                  "path operator",pcVar3);
          return LY_EVALID;
        }
        if ((set_local._7_1_ != '\0') &&
           (LVar2 = xpath_pi_node(set,LYXP_AXIS_DESCENDANT_OR_SELF,axis), LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
        scnode_skip_path = xpath_pi_node(set,LYXP_AXIS_PARENT,axis);
        if (scnode_skip_path != LY_SUCCESS) {
          return scnode_skip_path;
        }
      }
      pcVar3 = "parsed";
      if ((axis & 0x20) != LYXP_AXIS_ANCESTOR) {
        pcVar3 = "skipped";
      }
      pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar3,pcVar4,
                 (ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
      break;
    default:
      ly_log(set->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",0x2126
            );
      return LY_EINT;
    case LYXP_TOKEN_NAMETEST:
      scnode_skip_path =
           eval_name_test_with_predicate(exp,tok_idx,local_34,set_local._7_1_,set,axis);
      if (scnode_skip_path == LY_ENOT) {
        if ((axis & 0x1c) == LYXP_AXIS_ANCESTOR) {
          __assert_fail("options & LYXP_SCNODE_ALL",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                        ,0x2115,
                        "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                       );
        }
        scnode_skip_path = 0;
        axis = axis | 0x20;
      }
      goto joined_r0x0021bad1;
    case LYXP_TOKEN_NODETYPE:
      scnode_skip_path =
           eval_node_type_with_predicate(exp,tok_idx,local_34,set_local._7_1_,set,axis);
joined_r0x0021bad1:
      if (scnode_skip_path != LY_SUCCESS) {
        return scnode_skip_path;
      }
    }
    LVar2 = exp_check_token2((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_OPER_PATH,LYXP_TOKEN_OPER_RPATH);
    if (LVar2 != LY_SUCCESS) {
      return scnode_skip_path;
    }
    if (exp->tok_len[*tok_idx] == 1) {
      set_local._7_1_ = '\0';
    }
    else {
      if (exp->tok_len[*tok_idx] != 2) {
        __assert_fail("exp->tok_len[*tok_idx] == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x20c4,
                      "LY_ERR eval_relative_location_path(const struct lyxp_expr *, uint32_t *, ly_bool, struct lyxp_set *, uint32_t)"
                     );
      }
      set_local._7_1_ = '\x01';
    }
    pcVar3 = "parsed";
    if ((axis & 0x20) != LYXP_AXIS_ANCESTOR) {
      pcVar3 = "skipped";
    }
    pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_relative_location_path",pcVar3,pcVar4,
               (ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
  } while( true );
}

Assistant:

static LY_ERR
eval_relative_location_path(const struct lyxp_expr *exp, uint32_t *tok_idx, ly_bool all_desc, struct lyxp_set *set,
        uint32_t options)
{
    LY_ERR rc = LY_SUCCESS;
    enum lyxp_axis axis;
    int scnode_skip_path = 0;

    goto step;
    do {
        /* evaluate '/' or '//' */
        if (exp->tok_len[*tok_idx] == 1) {
            all_desc = 0;
        } else {
            assert(exp->tok_len[*tok_idx] == 2);
            all_desc = 1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

step:
        /* AxisSpecifier */
        if (exp->tokens[*tok_idx] == LYXP_TOKEN_AXISNAME) {
            axis = str2axis(exp->expr + exp->tok_pos[*tok_idx], exp->tok_len[*tok_idx]);

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);

            assert(exp->tokens[*tok_idx] == LYXP_TOKEN_DCOLON);
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else if (exp->tokens[*tok_idx] == LYXP_TOKEN_AT) {
            axis = LYXP_AXIS_ATTRIBUTE;

            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
        } else {
            /* default */
            axis = LYXP_AXIS_CHILD;
        }

        /* NodeTest Predicate* */
        switch (exp->tokens[*tok_idx]) {
        case LYXP_TOKEN_DOT:
            /* evaluate '.' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_SELF, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_DDOT:
            /* evaluate '..' */
            if (!(options & LYXP_SKIP_EXPR)) {
                if (((options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_SCNODE_SET)) ||
                        (!(options & LYXP_SCNODE_ALL) && (set->type != LYXP_SET_NODE_SET))) {
                    LOGVAL(set->ctx, LY_VCODE_XP_INOP_1, "path operator", print_set_type(set));
                    rc = LY_EVALID;
                    goto cleanup;
                }

                if (all_desc) {
                    rc = xpath_pi_node(set, LYXP_AXIS_DESCENDANT_OR_SELF, options);
                    LY_CHECK_GOTO(rc, cleanup);
                }
                rc = xpath_pi_node(set, LYXP_AXIS_PARENT, options);
                LY_CHECK_GOTO(rc, cleanup);
            }
            LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                    lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
            ++(*tok_idx);
            break;

        case LYXP_TOKEN_NAMETEST:
            /* evaluate NameTest Predicate* */
            rc = eval_name_test_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            if (rc == LY_ENOT) {
                assert(options & LYXP_SCNODE_ALL);
                rc = LY_SUCCESS;

                /* skip the rest of this path */
                scnode_skip_path = 1;
                options |= LYXP_SKIP_EXPR;
            }
            LY_CHECK_GOTO(rc, cleanup);
            break;

        case LYXP_TOKEN_NODETYPE:
            /* evaluate NodeType Predicate* */
            rc = eval_node_type_with_predicate(exp, tok_idx, axis, all_desc, set, options);
            LY_CHECK_GOTO(rc, cleanup);
            break;

        default:
            LOGINT(set->ctx);
            rc = LY_EINT;
            goto cleanup;
        }
    } while (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH));

cleanup:
    if (scnode_skip_path) {
        options &= ~LYXP_SKIP_EXPR;
    }
    return rc;
}